

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event_finder.cpp
# Opt level: O2

void __thiscall sc_core::sc_event_finder::report_error(sc_event_finder *this,char *id,char *add_msg)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  char *local_1c0;
  stringstream msg;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  if (add_msg != (char *)0x0) {
    poVar2 = std::operator<<(local_190,add_msg);
    std::operator<<(poVar2,": ");
  }
  poVar2 = std::operator<<(local_190,"port \'");
  poVar2 = std::operator<<(poVar2,(this->m_port->super_sc_object).m_name._M_dataplus._M_p);
  poVar2 = std::operator<<(poVar2,"\' (");
  iVar1 = (*(this->m_port->super_sc_object)._vptr_sc_object[3])();
  poVar2 = std::operator<<(poVar2,(char *)CONCAT44(extraout_var,iVar1));
  std::operator<<(poVar2,")");
  std::__cxx11::stringbuf::str();
  sc_report_handler::report
            (SC_ERROR,id,local_1c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/communication/sc_event_finder.cpp"
             ,0x33);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  return;
}

Assistant:

void
sc_event_finder::report_error( const char* id, const char* add_msg ) const
{
    std::stringstream msg;
    if (add_msg != 0)
        msg << add_msg << ": ";
    msg << "port '" << m_port.name() << "' (" << m_port.kind() << ")";
    SC_REPORT_ERROR( id, msg.str().c_str() );
}